

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O0

void __thiscall
axl::sl::
OwningListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
::clear(OwningListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::cry::AppStoreIap>_>
        *this)

{
  Delete<axl::cry::AppStoreIap> *in_RDI;
  AppStoreIap *p;
  ListLink *link;
  AppStoreIap *in_stack_ffffffffffffffc8;
  Entry *in_stack_ffffffffffffffe0;
  ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink> local_11;
  ListLink *local_10;
  
  if (*(long *)in_RDI != 0) {
    local_10 = ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>::operator()
                         (&local_11,*(AppStoreIap **)in_RDI);
    while (local_10 != (ListLink *)0x0) {
      in_stack_ffffffffffffffe0 =
           IteratorBase<axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::cry::AppStoreIap,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>
           ::getEntryFromLink(&in_stack_ffffffffffffffe0->super_ListLink);
      local_10 = ListLink::getNext(local_10);
      mem::Delete<axl::cry::AppStoreIap>::operator()(in_RDI,in_stack_ffffffffffffffc8);
    }
    ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
    ::construct((ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
                 *)in_RDI);
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}